

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PA4Application.cpp
# Opt level: O0

void __thiscall PA4Application::update(PA4Application *this)

{
  element_type *peVar1;
  double dVar2;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  float local_14;
  PA4Application *pPStack_10;
  float prevTime;
  PA4Application *this_local;
  
  local_14 = this->m_currentTime;
  pPStack_10 = this;
  dVar2 = glfwGetTime();
  this->m_currentTime = (float)dVar2;
  this->m_deltaTime = this->m_currentTime - local_14;
  peVar1 = std::__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->m_program);
  (**(peVar1->super_OGLStateObject)._vptr_OGLStateObject)();
  peVar1 = std::__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->m_program);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"V",&local_39);
  Program::setUniform<glm::mat<4,4,float,(glm::qualifier)0>>(peVar1,&local_38,&this->m_view);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  peVar1 = std::__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->m_program);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"P",&local_71);
  Program::setUniform<glm::mat<4,4,float,(glm::qualifier)0>>(peVar1,&local_70,&this->m_proj);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  peVar1 = std::__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->m_program);
  (*(peVar1->super_OGLStateObject)._vptr_OGLStateObject[1])();
  continuousKey(this);
  return;
}

Assistant:

void PA4Application::update()
{
  float prevTime = m_currentTime;
  m_currentTime = glfwGetTime();
  m_deltaTime = m_currentTime - prevTime;

  m_program->bind();
  m_program->setUniform("V", m_view);
  m_program->setUniform("P", m_proj);
  m_program->unbind();

  continuousKey();
}